

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::DragBehavior(ImRect *frame_bb,ImGuiID id,float *v,float v_speed,float v_min,float v_max,
                        int decimal_precision,float power)

{
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  ImU32 fill_col;
  ImGuiCol idx;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  pIVar2 = GImGui;
  if (GImGui->ActiveId == id) {
    idx = 9;
  }
  else {
    idx = (GImGui->HoveredId == id) + 7;
  }
  fill_col = GetColorU32(idx,1.0);
  RenderFrame(frame_bb->Min,frame_bb->Max,fill_col,true,(pIVar2->Style).FrameRounding);
  pIVar1 = GImGui;
  if (pIVar2->ActiveId == id) {
    if ((pIVar2->IO).MouseDown[0] == true) {
      if (pIVar2->ActiveIdIsJustActivated == false) {
        fVar4 = pIVar2->DragCurrentValue;
      }
      else {
        fVar4 = *v;
        pIVar2->DragCurrentValue = fVar4;
        (pIVar2->DragLastMouseDelta).x = 0.0;
        (pIVar2->DragLastMouseDelta).y = 0.0;
      }
      IVar5 = GetMouseDragDelta(0,1.0);
      fVar8 = (pIVar2->DragLastMouseDelta).x;
      fVar3 = IVar5.x;
      if (fVar3 != fVar8) {
        if ((v_speed == 0.0) && (!NAN(v_speed))) {
          fVar6 = v_max - v_min;
          if (((fVar6 != 0.0) || (NAN(fVar6))) && (fVar6 < 3.4028235e+38)) {
            v_speed = fVar6 * pIVar2->DragSpeedDefaultRatio;
          }
        }
        if (((pIVar2->IO).KeyShift == true) && (0.0 <= pIVar2->DragSpeedScaleFast)) {
          v_speed = v_speed * pIVar2->DragSpeedScaleFast;
        }
        if (((pIVar2->IO).KeyAlt == true) && (0.0 <= pIVar2->DragSpeedScaleSlow)) {
          v_speed = v_speed * pIVar2->DragSpeedScaleSlow;
        }
        fVar8 = (fVar3 - fVar8) * v_speed;
        if (ABS(power + -1.0) <= 0.001) {
          fVar4 = fVar4 + fVar8;
        }
        else {
          fVar7 = -fVar4;
          fVar6 = fVar4;
          if (fVar7 > fVar4) {
            fVar6 = fVar7;
          }
          fVar7 = *(float *)(&DAT_001889f8 + (ulong)(fVar7 <= fVar4) * 4);
          fVar6 = powf(fVar6,1.0 / power);
          fVar6 = fVar8 * fVar7 + fVar6;
          fVar8 = -fVar6;
          fVar4 = powf((float)(~-(uint)(fVar8 <= fVar6) & (uint)fVar8 |
                              -(uint)(fVar8 <= fVar6) & (uint)fVar6),power);
          fVar4 = fVar4 * fVar7;
          if (fVar6 < fVar8) {
            fVar4 = -fVar4;
          }
        }
        (pIVar2->DragLastMouseDelta).x = fVar3;
        if (v_min < v_max) {
          if (fVar4 <= v_max) {
            v_max = fVar4;
          }
          fVar4 = (float)(-(uint)(fVar4 < v_min) & (uint)v_min |
                         ~-(uint)(fVar4 < v_min) & (uint)v_max);
        }
        pIVar2->DragCurrentValue = fVar4;
      }
      fVar4 = RoundScalar(fVar4,decimal_precision);
      if ((*v != fVar4) || (NAN(*v) || NAN(fVar4))) {
        *v = fVar4;
        return true;
      }
    }
    else {
      GImGui->ActiveId = 0;
      pIVar1->ActiveIdIsJustActivated = true;
      pIVar1->ActiveIdAllowOverlap = false;
      pIVar1->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  return false;
}

Assistant:

bool ImGui::DragBehavior(const ImRect& frame_bb, ImGuiID id, float* v, float v_speed, float v_min, float v_max, int decimal_precision, float power)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    // Draw frame
    const ImU32 frame_col = GetColorU32(g.ActiveId == id ? ImGuiCol_FrameBgActive : g.HoveredId == id ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    RenderFrame(frame_bb.Min, frame_bb.Max, frame_col, true, style.FrameRounding);

    bool value_changed = false;

    // Process clicking on the drag
    if (g.ActiveId == id)
    {
        if (g.IO.MouseDown[0])
        {
            if (g.ActiveIdIsJustActivated)
            {
                // Lock current value on click
                g.DragCurrentValue = *v;
                g.DragLastMouseDelta = ImVec2(0.f, 0.f);
            }

            float v_cur = g.DragCurrentValue;
            const ImVec2 mouse_drag_delta = GetMouseDragDelta(0, 1.0f);
            if (fabsf(mouse_drag_delta.x - g.DragLastMouseDelta.x) > 0.0f)
            {
                float speed = v_speed;
                if (speed == 0.0f && (v_max - v_min) != 0.0f && (v_max - v_min) < FLT_MAX)
                    speed = (v_max - v_min) * g.DragSpeedDefaultRatio;
                if (g.IO.KeyShift && g.DragSpeedScaleFast >= 0.0f)
                    speed = speed * g.DragSpeedScaleFast;
                if (g.IO.KeyAlt && g.DragSpeedScaleSlow >= 0.0f)
                    speed = speed * g.DragSpeedScaleSlow;

                float delta = (mouse_drag_delta.x - g.DragLastMouseDelta.x) * speed;
                if (fabsf(power - 1.0f) > 0.001f)
                {
                    // Logarithmic curve on both side of 0.0
                    float v0_abs = v_cur >= 0.0f ? v_cur : -v_cur;
                    float v0_sign = v_cur >= 0.0f ? 1.0f : -1.0f;
                    float v1 = powf(v0_abs, 1.0f / power) + (delta * v0_sign);
                    float v1_abs = v1 >= 0.0f ? v1 : -v1;
                    float v1_sign = v1 >= 0.0f ? 1.0f : -1.0f;          // Crossed sign line
                    v_cur = powf(v1_abs, power) * v0_sign * v1_sign;    // Reapply sign
                }
                else
                {
                    v_cur += delta;
                }
                g.DragLastMouseDelta.x = mouse_drag_delta.x;

                // Clamp
                if (v_min < v_max)
                    v_cur = ImClamp(v_cur, v_min, v_max);
                g.DragCurrentValue = v_cur;
            }

            // Round to user desired precision, then apply
            v_cur = RoundScalar(v_cur, decimal_precision);
            if (*v != v_cur)
            {
                *v = v_cur;
                value_changed = true;
            }
        }
        else
        {
            SetActiveID(0);
        }
    }

    return value_changed;
}